

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O1

bool __thiscall
MipsParser::decodeCop2BranchCondition(MipsParser *this,string *text,size_t *pos,int *result)

{
  char cVar1;
  size_t stringPos;
  bool bVar2;
  
  stringPos = *pos;
  if (stringPos + 3 == text->_M_string_length) {
    bVar2 = startsWith(text,"any",stringPos);
    if (bVar2) {
      *result = 4;
    }
    else {
      bVar2 = startsWith(text,"all",*pos);
      if (!bVar2) {
        return false;
      }
      *result = 5;
    }
    *pos = *pos + 3;
    return true;
  }
  if (stringPos + 1 != text->_M_string_length) {
    return false;
  }
  *pos = stringPos + 1;
  cVar1 = (text->_M_dataplus)._M_p[stringPos];
  switch(cVar1) {
  case '0':
switchD_0016937e_caseD_30:
    *result = 0;
    break;
  case '1':
switchD_0016937e_caseD_31:
    *result = 1;
    break;
  case '2':
switchD_0016937e_caseD_32:
    *result = 2;
    break;
  case '3':
switchD_0016937e_caseD_33:
    *result = 3;
    break;
  case '4':
    *result = 4;
    break;
  case '5':
    *result = 5;
    break;
  default:
    switch(cVar1) {
    case 'w':
      goto switchD_0016937e_caseD_33;
    case 'x':
      goto switchD_0016937e_caseD_30;
    case 'y':
      goto switchD_0016937e_caseD_31;
    case 'z':
      goto switchD_0016937e_caseD_32;
    default:
      *pos = stringPos;
      return false;
    }
  }
  return true;
}

Assistant:

bool MipsParser::decodeCop2BranchCondition(const std::string& text, size_t& pos, int& result)
{
	if (pos+3 == text.size())
	{
		if (startsWith(text,"any",pos))
		{
			result = 4;
			pos += 3;
			return true;
		}
		if (startsWith(text,"all",pos))
		{
			result = 5;
			pos += 3;
			return true;
		}
	} else if (pos+1 == text.size())
	{
		switch (text[pos++])
		{
		case 'x':
		case '0':
			result = 0;
			return true;
		case 'y':
		case '1':
			result = 1;
			return true;
		case 'z':
		case '2':
			result = 2;
			return true;
		case 'w':
		case '3':
			result = 3;
			return true;
		case '4':
			result = 4;
			return true;
		case '5':
			result = 5;
			return true;
		}

		// didn't match it
		pos--;
	}

	return false;
}